

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

char * re2::TerminateNumber(char *buf,int nbuf,char *str,int *np,bool accept_spaces)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong __n;
  
  iVar5 = *np;
  pcVar7 = "";
  if (iVar5 < 1) {
    return pcVar7;
  }
  cVar3 = *str;
  iVar2 = isspace((int)cVar3);
  if (iVar2 == 0) {
LAB_0013f9c1:
    pcVar4 = str + (uint)(cVar3 == '-');
    uVar6 = iVar5 - (uint)(cVar3 == '-');
    if (((2 < uVar6) && (*pcVar4 == '0')) && (pcVar4[1] == '0')) {
      do {
        if (pcVar4[2] != '0') goto LAB_0013f9fe;
        pcVar4 = pcVar4 + 1;
        bVar1 = 3 < (int)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
      uVar6 = 2;
    }
LAB_0013f9fe:
    uVar6 = (cVar3 == '-') + uVar6;
    if (nbuf <= (int)uVar6) {
      return pcVar7;
    }
    __n = (ulong)uVar6;
    memmove(buf,pcVar4 + -(ulong)(cVar3 == '-'),__n);
    if (cVar3 == '-') {
      *buf = '-';
    }
  }
  else {
    if (!accept_spaces) {
      return pcVar7;
    }
    for (; 0 < iVar5; iVar5 = iVar5 + -1) {
      cVar3 = *str;
      iVar2 = isspace((int)cVar3);
      if (iVar2 == 0) goto LAB_0013f9c1;
      str = str + 1;
    }
    if (nbuf < 1) {
      return pcVar7;
    }
    __n = 0;
    uVar6 = 0;
  }
  buf[__n] = '\0';
  *np = uVar6;
  return buf;
}

Assistant:

static const char* TerminateNumber(char* buf, int nbuf, const char* str, int* np,
                                   bool accept_spaces) {
  int n = *np;
  if (n <= 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}